

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSystem,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcSystem *in;
  
  in = (IfcSystem *)operator_new(0x108);
  *(undefined ***)&(in->super_IfcGroup).field_0xf0 = &PTR__Object_007e4a70;
  *(undefined8 *)&in->field_0xf8 = 0;
  *(char **)&in->field_0x100 = "IfcSystem";
  Assimp::IFC::Schema_2x3::IfcGroup::IfcGroup((IfcGroup *)in,&PTR_construction_vtable_24__008525f0);
  *(undefined ***)&(in->super_IfcGroup).super_IfcObject = &PTR__IfcSystem_00852510;
  *(undefined ***)&(in->super_IfcGroup).field_0xf0 = &PTR__IfcSystem_008525d8;
  *(undefined ***)&(in->super_IfcGroup).super_IfcObject.field_0x88 = &PTR__IfcSystem_00852538;
  (in->super_IfcGroup).super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcSystem_00852560;
  *(undefined ***)&(in->super_IfcGroup).super_IfcObject.field_0xd0 = &PTR__IfcSystem_00852588;
  *(undefined ***)&(in->super_IfcGroup).super_IfcObject.field_0xe0 = &PTR__IfcSystem_008525b0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcSystem>(db,params,in);
  return (Object *)
         (&(in->super_IfcGroup).super_IfcObject.field_0x0 +
         *(long *)(*(long *)&(in->super_IfcGroup).super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }